

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.c
# Opt level: O2

void createHuffmanTree(HuffmanTree *huffmanTree,int *w,int n)

{
  undefined8 in_RAX;
  HuffmanTree paVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  int s2;
  int s1;
  
  lVar4 = (long)(n * 2);
  _s2 = in_RAX;
  paVar1 = (HuffmanTree)malloc(lVar4 << 4);
  *huffmanTree = paVar1;
  lVar2 = 0;
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  for (; uVar3 * 4 != lVar2; lVar2 = lVar2 + 4) {
    (&paVar1[1].weight)[lVar2] = *(uint *)((long)w + lVar2 + 4);
    *(undefined8 *)(&paVar1[1].parent + lVar2) = 0;
    (&paVar1[1].rchild)[lVar2] = 0;
  }
  lVar7 = (long)(n + 1);
  paVar1 = paVar1 + lVar7;
  for (lVar2 = lVar7; lVar2 < lVar4; lVar2 = lVar2 + 1) {
    paVar1->weight = 0;
    paVar1->parent = 0;
    paVar1->lchild = 0;
    paVar1->rchild = 0;
    paVar1 = paVar1 + 1;
  }
  puts("\nHuffmanTree");
  uVar3 = lVar7 * 0x10 | 0xc;
  for (; lVar7 < lVar4; lVar7 = lVar7 + 1) {
    selecte(huffmanTree,n,&s1,&s2);
    paVar1 = *huffmanTree;
    lVar2 = (long)s1;
    paVar1[lVar2].parent = 1;
    lVar6 = (long)s2;
    paVar1[lVar6].parent = 1;
    *(int *)((long)paVar1 + (uVar3 - 4)) = s1;
    *(int *)((long)&paVar1->weight + uVar3) = s2;
    uVar5 = paVar1[lVar6].weight + paVar1[lVar2].weight;
    *(uint *)((long)paVar1 + (uVar3 - 0xc)) = uVar5;
    printf("%d (%d,%d)\n",(ulong)uVar5,(ulong)paVar1[lVar2].weight,(ulong)paVar1[lVar6].weight);
    n = n + 1;
    uVar3 = uVar3 + 0x10;
  }
  putchar(10);
  return;
}

Assistant:

void createHuffmanTree(HuffmanTree *huffmanTree,int w[],int n){
    //m为哈夫曼树总共的节点数，n为叶子结点数
    int m = 2 * n - 1;
    //s1和s2为当前结点里，要选取的最小权值结点
    int s1;
    int s2;
    //标记
    int i;
    //创建哈夫曼树的结点所需要的空间，m + 1,代表其中包含一个头结点
    *huffmanTree = (HuffmanTree)malloc((m + 1) * sizeof(Node));
    //1--n号放叶子节点，初始化叶子结点，初始的时候看做一个个单个结点的二叉树
    for(i = 1;i <= n;i++){
        //其中叶子结点的权值是w【n】数组来保存
        (*huffmanTree)[i].weight = w[i];
        //初始化叶子结点（单个二叉树）的孩子和双亲，单个节点，也就是没有孩子和双亲，==0
        (*huffmanTree)[i].lchild = 0;
        (*huffmanTree)[i].parent = 0;
        (*huffmanTree)[i].rchild = 0;
    }
    //非叶子结点的初始化
    for(int i = n + 1;i <= m;i++){
        (*huffmanTree)[i].weight = 0;
        (*huffmanTree)[i].lchild = 0;
        (*huffmanTree)[i].parent = 0;
        (*huffmanTree)[i].rchild = 0;
    }
    printf("\nHuffmanTree\n");
    //创建非叶子结点，建哈夫曼树
    for(i = n + 1;i <= m; i++){
        //在haffmantree【1】~huffmantree【i - 1】的范围内选择两个parent为0
        //且weight最小的结点，其序号分别为s1，s2
        selecte(huffmanTree,i - 1,&s1,&s2);
        //选出的两个权值最小的叶子结点，组成一个新的二叉树，根为i结点
        (*huffmanTree)[s1].parent = 1;
        (*huffmanTree)[s2].parent = 1;
        (*huffmanTree)[i].lchild = s1;
        (*huffmanTree)[i].rchild = s2;
        //新结点i的权值
        (*huffmanTree)[i].weight = (*huffmanTree)[s1].weight + (*huffmanTree)[s2].weight;
        printf("%d (%d,%d)\n",(*huffmanTree)[i].weight,(*huffmanTree)[s1].weight,(*huffmanTree)[s2].weight);
    }
    printf("\n");
}